

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KdTree.h
# Opt level: O0

void __thiscall
lazyTrees::LazyKdTree<Point2D>::LazyKdTree
          (LazyKdTree<Point2D> *this,vector<Point2D,_std::allocator<Point2D>_> *in,int dimension)

{
  vector<Point2D,_std::allocator<Point2D>_> *this_00;
  size_t sVar1;
  int in_EDX;
  vector<Point2D,_std::allocator<Point2D>_> *in_RDI;
  vector<Point2D,_std::allocator<Point2D>_> *__p;
  LazyKdTree<Point2D> *this_01;
  
  __p = in_RDI;
  this_00 = (vector<Point2D,_std::allocator<Point2D>_> *)operator_new(0x18);
  std::vector<Point2D,_std::allocator<Point2D>_>::vector(this_00,__p);
  std::
  unique_ptr<std::vector<Point2D,std::allocator<Point2D>>,std::default_delete<std::vector<Point2D,std::allocator<Point2D>>>>
  ::unique_ptr<std::default_delete<std::vector<Point2D,std::allocator<Point2D>>>,void>
            ((unique_ptr<std::vector<Point2D,_std::allocator<Point2D>_>,_std::default_delete<std::vector<Point2D,_std::allocator<Point2D>_>_>_>
              *)this_00,__p);
  std::
  unique_ptr<lazyTrees::LazyKdTree<Point2D>,std::default_delete<lazyTrees::LazyKdTree<Point2D>>>::
  unique_ptr<std::default_delete<lazyTrees::LazyKdTree<Point2D>>,void>
            ((unique_ptr<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
              *)this_00,__p);
  this_01 = (LazyKdTree<Point2D> *)
            &(in_RDI->super__Vector_base<Point2D,_std::allocator<Point2D>_>)._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::
  unique_ptr<lazyTrees::LazyKdTree<Point2D>,std::default_delete<lazyTrees::LazyKdTree<Point2D>>>::
  unique_ptr<std::default_delete<lazyTrees::LazyKdTree<Point2D>>,void>
            ((unique_ptr<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
              *)this_00,__p);
  std::unique_ptr<Point2D,std::default_delete<Point2D>>::
  unique_ptr<std::default_delete<Point2D>,void>
            ((unique_ptr<Point2D,_std::default_delete<Point2D>_> *)this_00,__p);
  sVar1 = Point2D::dimensions();
  in_RDI[1].super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)(long)in_EDX % sVar1);
  throw_if_input_empty(this_01);
  return;
}

Assistant:

LazyKdTree(std::vector<P>&& in, int dimension = 0)
        : inputData(new std::vector<P>(std::move(in)))
        , childNegative(nullptr)
        , childPositive(nullptr)
        , data(nullptr)
        , dim(dimension % P::dimensions())
    {
      throw_if_input_empty();
    }